

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O3

int file_openfile(char *filename,int rwmode,FILE **diskfile)

{
  long lVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  passwd *ppVar6;
  size_t sVar7;
  FILE *pFVar8;
  ulong uVar9;
  char *__s_00;
  char *__dest;
  char mode [4];
  char user [80];
  char tempname [1024];
  undefined4 local_47c;
  char local_478 [80];
  char local_428 [1024];
  
  if (rwmode == 1) {
    local_47c = 0x622b72;
  }
  else {
    uVar2 = (uint)local_47c >> 0x10;
    local_47c = CONCAT22((ushort)uVar2 & 0xff00,0x6272);
  }
  __dest = filename;
  if (*filename == '~') {
    __s_00 = filename + 1;
    cVar3 = filename[1];
    if (cVar3 == '/') {
      __s = getenv("HOME");
      if (__s == (char *)0x0) {
        sVar5 = strlen(filename);
        if (0x3ff < sVar5) {
          return 0x68;
        }
        __dest = local_428;
        strcpy(__dest,filename);
        goto LAB_001173cf;
      }
      sVar5 = strlen(__s);
    }
    else {
      uVar9 = 0;
      while ((cVar3 != '\0' && (cVar3 != '/'))) {
        local_478[uVar9] = cVar3;
        lVar1 = uVar9 + 2;
        uVar9 = uVar9 + 1;
        cVar3 = filename[lVar1];
      }
      local_478[uVar9 & 0xffffffff] = '\0';
      ppVar6 = getpwnam(local_478);
      __s = ppVar6->pw_dir;
      sVar5 = strlen(__s);
      __s_00 = __s_00 + uVar9;
    }
    sVar7 = strlen(__s_00);
    if (0x3ff < sVar7 + sVar5) {
      return 0x68;
    }
    __dest = local_428;
    strcpy(__dest,__s);
    strcat(__dest,__s_00);
  }
LAB_001173cf:
  pFVar8 = fopen64(__dest,(char *)&local_47c);
  *diskfile = (FILE *)pFVar8;
  iVar4 = 0x68;
  if (pFVar8 != (FILE *)0x0) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int file_openfile(char *filename, int rwmode, FILE **diskfile)
/*
   lowest level routine to physically open a disk file
*/
{
#if defined(_WIN32)
    wchar_t mode[4];
#else
    char mode[4];
#endif


#if defined(unix) || defined(__unix__) || defined(__unix)
    char tempname[1024], *cptr, user[80];
    struct passwd *pwd;
    int ii = 0;

#if defined(REPLACE_LINKS)
    struct stat stbuf;
    int success = 0;
    size_t n;
    FILE *f1, *f2;
    char buf[BUFSIZ];
#endif

#endif

#if defined(_WIN32)
    if (rwmode == READWRITE)
    {
        wcscpy(mode, L"r+b");    /* open existing file with read-write */
    }
    else
    {
        wcscpy(mode, L"rb");     /* open existing file readonly */
    }
#else
    if (rwmode == READWRITE)
    {
          strcpy(mode, "r+b");    /* open existing file with read-write */
    }
    else
    {
          strcpy(mode, "rb");     /* open existing file readonly */
    }
#endif

#if MACHINE == ALPHAVMS || MACHINE == VAXVMS
        /* specify VMS record structure: fixed format, 2880 byte records */
        /* but force stream mode access to enable random I/O access      */
    *diskfile = fopen(filename, mode, "rfm=fix", "mrs=2880", "ctx=stm"); 

#elif defined(unix) || defined(__unix__) || defined(__unix)

    /* support the ~user/file.fits or ~/file.fits filenames in UNIX */

    if (*filename == '~')
    {
        if (filename[1] == '/')
        {
            cptr = getenv("HOME");
            if (cptr)
            {
                 if (strlen(cptr) + strlen(filename+1) > 1023)
		      return(FILE_NOT_OPENED); 

                 strcpy(tempname, cptr);
                 strcat(tempname, filename+1);
            }
            else
            {
                 if (strlen(filename) > 1023)
		      return(FILE_NOT_OPENED); 

                 strcpy(tempname, filename);
            }
        }
        else
        {
            /* copy user name */
            cptr = filename+1;
            while (*cptr && (*cptr != '/'))
            {
                user[ii] = *cptr;
                cptr++;
                ii++;
            }
            user[ii] = '\0';

            /* get structure that includes name of user's home directory */
            pwd = getpwnam(user);

            /* copy user's home directory */
            if (strlen(pwd->pw_dir) + strlen(cptr) > 1023)
		      return(FILE_NOT_OPENED); 

            strcpy(tempname, pwd->pw_dir);
            strcat(tempname, cptr);
        }

        *diskfile = fopen(tempname, mode); 
    }
    else
    {
        /* don't need to expand the input file name */
        *diskfile = fopen(filename, mode); 

#if defined(REPLACE_LINKS)

        if (!(*diskfile) && (rwmode == READWRITE))  
        {
           /* failed to open file with READWRITE privilege.  Test if  */
           /* the file we are trying to open is a soft link to a file that */
           /* doesn't have write privilege.  */

           lstat(filename, &stbuf);
           if ((stbuf.st_mode & S_IFMT) == S_IFLNK) /* is this a soft link? */
           {
              if ((f1 = fopen(filename, "rb")) != 0) /* try opening READONLY */
              {

                 if (strlen(filename) + 7 > 1023)
		      return(FILE_NOT_OPENED); 

                 strcpy(tempname, filename);
                 strcat(tempname, ".TmxFil");
                 if ((f2 = fopen(tempname, "wb")) != 0) /* create temp file */
                 {
                    success = 1;
                    while ((n = fread(buf, 1, BUFSIZ, f1)) > 0)
                    {
                       /* copy linked file to local temporary file */
                       if (fwrite(buf, 1, n, f2) != n) 
                       {
                          success = 0;
                          break;
                       } 
                    }
                    fclose(f2);
                 }
                 fclose(f1);
  
                 if (success)
                 {
                    /* delete link and rename temp file to previous link name */
                    remove(filename);
                    rename(tempname, filename);

                    /* try once again to open the file with write access */
                    *diskfile = fopen(filename, mode); 
                 }
                 else
                    remove(tempname);  /* clean up the failed copy */
              }
           }
        }
#endif

    }

#elif defined(_WIN32)
    /* Windows 
    * 
	*  Assume that the input filename is in UTF-8 encoding and convert to UTF-16.
   	*/
    {
        UINT inputCodePage = CP_UTF8;
        /*
        *  For UTF-8, dwFlags must be set to either 0 or
        *  MB_ERR_INVALID_CHARS.
        */
        DWORD flags = 0;
        int outputLength = 0, rc = 0;
        /*
        *  Call MultiByteToWideChar with an output buffer size of zero to determine
        *  how large an output buffer is actually necessary.
        */
        outputLength = MultiByteToWideChar(
            inputCodePage,
            flags,
            filename,
            -1,
            NULL,
            0
        );

        /*
        *  Actually convert the file name to UTF-16
        */
        wchar_t *wideFilename = (wchar_t*)malloc(sizeof(wchar_t) * outputLength);

        rc = MultiByteToWideChar(
            inputCodePage,
            flags,
            filename,
            -1,
            wideFilename,
            outputLength
        );

        /*
        *  If the conversion worked, open the file.
        */
        if (0 != rc)
            *diskfile = _wfopen(wideFilename, mode);
        free(wideFilename);
    }
#else
    /* other non-UNIX machines */
	*diskfile = fopen(filename, mode);
#endif


    if (!(*diskfile))           /* couldn't open file */
    {
            return(FILE_NOT_OPENED); 
    }
    return(0);
}